

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

void ncnn::yuv420sp2rgb_half(uchar *yuv,int w,int h,uchar *rgb)

{
  int *piVar1;
  undefined1 *in_RCX;
  int in_EDX;
  int in_ESI;
  byte *in_RDI;
  int buv;
  int guv;
  int ruv;
  int u;
  int v;
  int y;
  int idx;
  int i;
  int tailstep;
  int hstep;
  uchar *py1;
  uchar *py0;
  uchar *puv;
  int local_7c [3];
  int local_70 [3];
  int local_64 [3];
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  byte *local_30;
  byte *local_28;
  byte *local_20;
  undefined1 *local_18;
  int local_c;
  
  local_20 = in_RDI + in_ESI * in_EDX;
  local_30 = in_RDI + in_ESI;
  local_34 = in_EDX / 2;
  local_38 = in_ESI / 2;
  local_28 = in_RDI;
  local_18 = in_RCX;
  local_c = in_ESI;
  for (local_3c = 0; local_3c < local_34; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < local_38; local_40 = local_40 + 1) {
      local_44 = ((uint)*local_28 + (uint)local_28[1] + (uint)local_30[2] + (uint)local_30[1]) *
                 0x10;
      local_48 = *local_20 - 0x80;
      local_4c = local_20[1] - 0x80;
      local_50 = local_48 * 0x5a;
      local_54 = local_48 * -0x2e + local_4c * -0x16;
      local_58 = local_4c * 0x71;
      local_64[2] = local_44 + local_50 >> 6;
      local_64[1] = 0;
      piVar1 = std::max<int>(local_64 + 2,local_64 + 1);
      local_64[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_64);
      *local_18 = (char)*piVar1;
      local_70[2] = local_44 + local_54 >> 6;
      local_70[1] = 0;
      piVar1 = std::max<int>(local_70 + 2,local_70 + 1);
      local_70[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_70);
      local_18[1] = (char)*piVar1;
      local_7c[2] = local_44 + local_58 >> 6;
      local_7c[1] = 0;
      piVar1 = std::max<int>(local_7c + 2,local_7c + 1);
      local_7c[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_7c);
      local_18[2] = (char)*piVar1;
      local_18 = local_18 + 3;
      local_28 = local_28 + 2;
      local_30 = local_30 + 2;
      local_20 = local_20 + 2;
    }
    local_28 = local_30;
    local_30 = local_30 + local_c;
  }
  return;
}

Assistant:

void yuv420sp2rgb_half(const unsigned char* yuv, int w, int h, unsigned char* rgb)
{
    const unsigned char* puv = yuv + w * h;
    const unsigned char *py0 = yuv, *py1 = yuv + w;
    const int hstep = h / 2;
#if __ARM_NEON
    const int wstep = w / 16, tailstep = (w - wstep * 16) / 2;
    uint8x8_t _u128 = vdup_n_u8(128);
    int8x8_t _s90 = vdup_n_s8(90);
    int8x8_t _sn46 = vdup_n_s8(-46);
    int8x8_t _s113 = vdup_n_s8(113);
    int8x8_t _sn22 = vdup_n_s8(-22);
    int16x8_t _s0 = vdupq_n_s16(0);
    int16x8_t _s16320 = vdupq_n_s16(16320); // 255 << 6
#else
    const int tailstep = w / 2;
#endif

    for (int i = 0; i < hstep; ++i)
    {
#if __ARM_NEON
        for (int j = 0; j < wstep; ++j)
        {
            uint8x16_t y0 = vld1q_u8(py0);
            uint8x16_t y1 = vld1q_u8(py1);

            // first 8 Y
            uint16x8_t low = vaddl_u8(vget_low_u8(y0), vget_low_u8(y1));
            uint16x4_t low_sum = vpadd_u16(vget_low_u16(low), vget_high_u16(low));

            // last 8 Y
            uint16x8_t high = vaddl_u8(vget_high_u8(y0), vget_high_u8(y1));
            uint16x4_t high_sum = vpadd_u16(vget_low_u16(high), vget_high_u16(high));

            uint16x8_t y8_sum = vcombine_u16(low_sum, high_sum);
            // y8 = (y8_sum >> 2) << 6 = y8_sum << 4;
            int16x8_t y8 = vreinterpretq_s16_u16(vshlq_n_u16(y8_sum, 4));

            // prepare uv
            uint8x8x2_t vu = vld2_u8(puv);
            int8x8_t v = vreinterpret_s8_u8(vsub_u8(vu.val[0], _u128));
            int8x8_t u = vreinterpret_s8_u8(vsub_u8(vu.val[1], _u128));

            int16x8_t r_acc = vmlal_s8(y8, v, _s90);
            int16x8_t g_acc = vmlal_s8(y8, v, _sn46);
            g_acc = vmlal_s8(g_acc, u, _sn22);
            int16x8_t b_acc = vmlal_s8(y8, u, _s113);

#define SHIFT_6_SATURATE(FROM, TO)                     \
    FROM = vmaxq_s16(vminq_s16((FROM), _s16320), _s0); \
    uint8x8_t TO = vshrn_n_u16(vreinterpretq_u16_s16((FROM)), 6);

            SHIFT_6_SATURATE(b_acc, b_out)
            SHIFT_6_SATURATE(g_acc, g_out)
            SHIFT_6_SATURATE(r_acc, r_out)
#undef SHIFT_6_SATURATE

            uint8x8x3_t _rgb;
            _rgb.val[0] = r_out;
            _rgb.val[1] = g_out;
            _rgb.val[2] = b_out;
            vst3_u8(rgb, _rgb);

            rgb += 24;
            py0 += 16;
            py1 += 16;
            puv += 16;
        }
#endif

        for (int idx = 0; idx < tailstep; ++idx)
        {
            int y = (static_cast<int>(py0[0]) + py0[1] + py1[2] + py1[1]) << 4;
            int v = static_cast<int>(puv[0]) - 128;
            int u = static_cast<int>(puv[1]) - 128;

            int ruv = 90 * v;
            int guv = -46 * v + -22 * u;
            int buv = 113 * u;

#define SATURATE_CAST_UCHAR(X) (unsigned char)::std::min(::std::max((int)(X), 0), 255);
            rgb[0] = SATURATE_CAST_UCHAR((y + ruv) >> 6);
            rgb[1] = SATURATE_CAST_UCHAR((y + guv) >> 6);
            rgb[2] = SATURATE_CAST_UCHAR((y + buv) >> 6);
#undef SATURATE_CAST_UCHAR

            rgb += 3;
            py0 += 2;
            py1 += 2;
            puv += 2;
        }
        // next two row
        py0 = py1;
        py1 = py0 + w;
    }
}